

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O0

string * __thiscall
t_haxe_generator::get_cap_name(string *__return_storage_ptr__,t_haxe_generator *this,string *name)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  undefined1 *puVar7;
  char cVar8;
  ulong local_1a8;
  size_t index;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string local_100;
  string local_e0 [8];
  string inner;
  bool found;
  ulong uStack_b8;
  int nested;
  size_t comma_pos;
  size_t comma_start;
  undefined1 local_a0 [8];
  string new_inner;
  string local_70 [8];
  string inner_types;
  string outer_type;
  size_t generic_last;
  size_t generic_first;
  string *name_local;
  t_haxe_generator *this_local;
  
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    cVar8 = (char)name;
    lVar2 = std::__cxx11::string::find(cVar8,0x3c);
    lVar3 = std::__cxx11::string::rfind(cVar8,0x3e);
    if ((lVar2 == -1) || (lVar3 == -1)) {
      uVar4 = std::__cxx11::string::find_first_not_of((char *)name,0x4c9a95);
      uVar6 = std::__cxx11::string::length();
      if (uVar4 < uVar6) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)name);
        iVar1 = tolower((int)*pcVar5);
        puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)name);
        *puVar7 = (char)iVar1;
        local_1a8 = std::__cxx11::string::find(cVar8,0x2e);
        while (local_1a8 != -1) {
          uVar4 = std::__cxx11::string::length();
          if (local_1a8 + 1 < uVar4) {
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)name);
            iVar1 = tolower((int)*pcVar5);
            puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)name);
            *puVar7 = (char)iVar1;
          }
          local_1a8 = std::__cxx11::string::find(cVar8,0x2e);
        }
      }
      lVar2 = std::__cxx11::string::rfind(cVar8,0x2e);
      if (lVar2 == -1) {
        local_1a8 = std::__cxx11::string::find_first_not_of((char *)name,0x4c9a95);
      }
      else {
        local_1a8 = lVar2 + 1;
      }
      uVar4 = std::__cxx11::string::length();
      if (local_1a8 < uVar4) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)name);
        iVar1 = toupper((int)*pcVar5);
        puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)name);
        *puVar7 = (char)iVar1;
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
    }
    else {
      std::__cxx11::string::substr((ulong)((long)&inner_types.field_2 + 8),(ulong)name);
      std::__cxx11::string::substr((ulong)local_70,(ulong)name);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_a0,"",(allocator *)((long)&comma_start + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&comma_start + 7));
      comma_pos = 0;
      while (uVar4 = std::__cxx11::string::length(), comma_pos < uVar4) {
        inner.field_2._12_4_ = 0;
        for (uStack_b8 = comma_pos; uVar4 = std::__cxx11::string::length(), uStack_b8 < uVar4;
            uStack_b8 = uStack_b8 + 1) {
          inner.field_2._M_local_buf[0xb] = '\0';
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_70);
          cVar8 = *pcVar5;
          if (cVar8 == ',') {
            inner.field_2._M_local_buf[0xb] = inner.field_2._12_4_ == 0;
          }
          else if (cVar8 == '<') {
            inner.field_2._12_4_ = inner.field_2._12_4_ + 1;
          }
          else if (cVar8 == '>') {
            inner.field_2._12_4_ = inner.field_2._12_4_ + -1;
          }
          if ((inner.field_2._M_local_buf[0xb] & 1U) != 0) break;
        }
        lVar2 = std::__cxx11::string::length();
        if (lVar2 != 0) {
          std::__cxx11::string::operator+=((string *)local_a0,",");
        }
        std::__cxx11::string::substr((ulong)local_e0,(ulong)local_70);
        std::__cxx11::string::string((string *)&local_120,local_e0);
        get_cap_name(&local_100,this,&local_120);
        std::__cxx11::string::operator+=((string *)local_a0,(string *)&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_120);
        comma_pos = uStack_b8 + 1;
        std::__cxx11::string::~string(local_e0);
      }
      std::__cxx11::string::string
                ((string *)&index,(string *)(inner_types.field_2._M_local_buf + 8));
      get_cap_name(&local_180,this,(string *)&index);
      std::operator+(&local_160,&local_180,"<");
      std::operator+(&local_140,&local_160,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(__return_storage_ptr__,&local_140,">");
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&index);
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string((string *)(inner_types.field_2._M_local_buf + 8));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_haxe_generator::get_cap_name(std::string name) {
  if (name.length() == 0) {
    return name;
  }

  // test.for.Generic< data.Type, or.the.Like> and handle it recursively
  size_t generic_first = name.find('<');
  size_t generic_last = name.rfind('>');
  if ((generic_first != std::string::npos) && (generic_last != std::string::npos)) {
    string outer_type = name.substr(0, generic_first);
    string inner_types = name.substr(generic_first + 1, generic_last - generic_first - 1);

    string new_inner = "";
    size_t comma_start = 0;
    while (comma_start < inner_types.length()) {
      size_t comma_pos = comma_start;
      int nested = 0;

      while (comma_pos < inner_types.length()) {
        bool found = false;
        switch (inner_types[comma_pos]) {
        case '<':
          ++nested;
          break;
        case '>':
          --nested;
          break;
        case ',':
          found = (nested == 0);
          break;
        }
        if (found) {
          break;
        }
        ++comma_pos;
      }

      if (new_inner.length() > 0) {
        new_inner += ",";
      }

      string inner = inner_types.substr(comma_start, comma_pos - comma_start);
      new_inner += get_cap_name(inner);
      comma_start = ++comma_pos;
    }

    return get_cap_name(outer_type) + "<" + new_inner + ">";
  }

  // package name
  size_t index = name.find_first_not_of(" \n\r\t");
  if (index < name.length()) {
    name[index] = tolower(name[index]);
    index = name.find('.');
    while (index != std::string::npos) {
      if (++index < name.length()) {
        name[index] = tolower(name[index]);
      }
      index = name.find('.', index);
    }
  }

  // class name
  index = name.rfind('.');
  if (index != std::string::npos) {
    ++index;
  } else {
    index = name.find_first_not_of(" \n\r\t");
  }

  if (index < name.length()) {
    name[index] = toupper(name[index]);
  }

  return name;
}